

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O3

void __thiscall Am_Font_Data::Print(Am_Font_Data *this,ostream *os)

{
  size_t sVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (this->name != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Am_Font From File(",0x12);
    pcVar5 = this->name;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar1 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,sVar1);
    }
    pcVar5 = ")";
    goto switchD_002809f2_caseD_4;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"Am_Font(",8);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")=[",3);
  switch(this->family) {
  case Am_FONT_FIXED:
    pcVar5 = "FIXED";
    goto LAB_0028095e;
  case Am_FONT_SERIF:
    pcVar5 = "SERIF";
LAB_0028095e:
    lVar3 = 5;
    break;
  case Am_FONT_SANS_SERIF:
    pcVar5 = "SANS_SERIF";
    lVar3 = 10;
    break;
  case Am_FONT_JFIXED:
    pcVar5 = "JFIXED";
    goto LAB_00280975;
  case Am_FONT_JPROPORTIONAL:
    pcVar5 = "JPROPORTIONAL";
    lVar3 = 0xd;
    break;
  case Am_FONT_CFIXED:
    pcVar5 = "CFIXED";
    goto LAB_00280975;
  case Am_FONT_KFIXED:
    pcVar5 = "KFIXED";
LAB_00280975:
    lVar3 = 6;
    break;
  default:
    goto switchD_00280904_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,lVar3);
switchD_00280904_default:
  if (this->bold == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", BOLD",6);
  }
  if (this->italic == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", ITALIC",8);
  }
  if (this->underline == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", UNDERLINE",0xb);
  }
  pcVar5 = "]";
  switch(this->size) {
  case Am_FONT_SMALL:
    pcVar4 = ", SMALL";
    goto LAB_00280a32;
  case Am_FONT_MEDIUM:
    pcVar4 = ", MEDIUM";
    goto LAB_00280a4e;
  case Am_FONT_LARGE:
    pcVar4 = ", LARGE";
LAB_00280a32:
    lVar3 = 7;
    break;
  case Am_FONT_VERY_LARGE:
    pcVar4 = ", VERY_LARGE";
    lVar3 = 0xc;
    break;
  default:
    goto switchD_002809f2_caseD_4;
  case Am_FONT_TSMALL:
    pcVar4 = ", TSMALL";
    goto LAB_00280a4e;
  case Am_FONT_TMEDIUM:
    pcVar4 = ", TMEDIUM";
    lVar3 = 9;
    break;
  case Am_FONT_TLARGE:
    pcVar4 = ", TLARGE";
LAB_00280a4e:
    lVar3 = 8;
    break;
  case Am_FONT_TVERY_LARGE:
    pcVar4 = ", TVERY_LARGE";
    lVar3 = 0xd;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
switchD_002809f2_caseD_4:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,1);
  return;
}

Assistant:

void
Am_Font_Data::Print(std::ostream &os) const
{
  const char *lookup_name = nullptr;
#ifdef DEBUG
  lookup_name = Am_Get_Name_Of_Item(this);
#endif
  if (lookup_name)
    os << lookup_name;
  else if (name)
    os << "Am_Font From File(" << name << ")";
  else {
    os << "Am_Font(" << std::hex << (unsigned long)this << std::dec << ")=[";
    switch (family) {
    case Am_FONT_FIXED:
      os << "FIXED";
      break;
    case Am_FONT_SERIF:
      os << "SERIF";
      break;
    case Am_FONT_SANS_SERIF:
      os << "SANS_SERIF";
      break;
    case Am_FONT_JFIXED:
      os << "JFIXED";
      break;
    case Am_FONT_JPROPORTIONAL:
      os << "JPROPORTIONAL";
      break;
    case Am_FONT_CFIXED:
      os << "CFIXED";
      break;
    case Am_FONT_KFIXED:
      os << "KFIXED";
      break;
    }
    if (bold)
      os << ", BOLD";
    if (italic)
      os << ", ITALIC";
    if (underline)
      os << ", UNDERLINE";
    switch (size) {
    case Am_FONT_SMALL:
      os << ", SMALL";
      break;
    case Am_FONT_MEDIUM:
      os << ", MEDIUM";
      break;
    case Am_FONT_LARGE:
      os << ", LARGE";
      break;
    case Am_FONT_VERY_LARGE:
      os << ", VERY_LARGE";
      break;
    case Am_FONT_TSMALL:
      os << ", TSMALL";
      break;
    case Am_FONT_TMEDIUM:
      os << ", TMEDIUM";
      break;
    case Am_FONT_TLARGE:
      os << ", TLARGE";
      break;
    case Am_FONT_TVERY_LARGE:
      os << ", TVERY_LARGE";
      break;
    }
    os << "]";
  }
}